

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd_test.cc
# Opt level: O0

void __thiscall RIPEMDTest_RunTest_Test::TestBody(RIPEMDTest_RunTest_Test *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n;
  char *pcVar2;
  pointer puVar3;
  Message *message;
  AssertHelper local_1d8;
  Message local_1d0;
  Span<const_unsigned_char> local_1c8;
  Bytes local_1b8;
  Span<const_unsigned_char> local_1a8;
  Bytes local_198;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_1;
  uint8_t digest [20];
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_158;
  __array buf;
  Message local_148;
  Span<const_unsigned_char> local_140;
  Bytes local_130;
  Span<const_unsigned_char> local_120;
  Bytes local_110;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  size_t todo;
  size_t remaining;
  size_t done;
  RIPEMD160_CTX ctx;
  uint8_t digest_1 [20];
  ScopedTrace local_49;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_48;
  ScopedTrace gtest_trace_65;
  size_t stride;
  size_t input_len;
  RIPEMDTestCase *pRStack_30;
  ScopedTrace gtest_trace_61;
  RIPEMDTestCase *test;
  RIPEMDTestCase *__end1;
  RIPEMDTestCase *__begin1;
  RIPEMDTestCase (*__range1) [8];
  RIPEMDTest_RunTest_Test *this_local;
  
  for (__end1 = kRIPEMDTestCases; __end1 != (RIPEMDTestCase *)&vtable; __end1 = __end1 + 1) {
    pRStack_30 = __end1;
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)((long)&input_len + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/ripemd_test.cc"
               ,0x3d,__end1->input);
    n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        strlen(pRStack_30->input);
    for (_Stack_48._M_head_impl =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        _Stack_48._M_head_impl <= n;
        _Stack_48._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(_Stack_48._M_head_impl)->field_0x1) {
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&local_49,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/ripemd_test.cc"
                 ,0x41,(unsigned_long *)&stack0xffffffffffffffb8);
      if (_Stack_48._M_head_impl ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        RIPEMD160((uchar *)pRStack_30->input,(size_t)n,ctx.data + 0x3c);
      }
      else {
        RIPEMD160_Init((RIPEMD160_CTX *)&done);
        for (remaining = 0; remaining < n;
            remaining = (long)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + remaining) {
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )_Stack_48._M_head_impl;
          if ((long)n - remaining < _Stack_48._M_head_impl) {
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )((long)n - remaining);
          }
          RIPEMD160_Update((RIPEMD160_CTX *)&done,pRStack_30->input + remaining,
                           (size_t)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
        }
        RIPEMD160_Final(ctx.data + 0x3c,(RIPEMD160_CTX *)&done);
      }
      bssl::Span<unsigned_char_const>::Span<20ul>
                ((Span<unsigned_char_const> *)&local_120,(uchar (*) [20])(ctx.data + 0x3c));
      Bytes::Bytes(&local_110,local_120);
      bssl::Span<unsigned_char_const>::Span<20ul>
                ((Span<unsigned_char_const> *)&local_140,&pRStack_30->expected);
      Bytes::Bytes(&local_130,local_140);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_100,"Bytes(digest)","Bytes(test.expected)",&local_110,&local_130)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
      if (!bVar1) {
        testing::Message::Message(&local_148);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&buf,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/ripemd_test.cc"
                   ,0x58,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&buf,&local_148);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf);
        testing::Message::~Message(&local_148);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      testing::ScopedTrace::~ScopedTrace(&local_49);
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&input_len + 7));
  }
  std::make_unique<unsigned_char[]>((size_t)&local_158);
  puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get(&local_158);
  ::OPENSSL_memset(puVar3,0x61,1000000);
  puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get(&local_158);
  RIPEMD160(puVar3,1000000,(uchar *)&gtest_ar_1.message_);
  bssl::Span<unsigned_char_const>::Span<20ul>
            ((Span<unsigned_char_const> *)&local_1a8,(uchar (*) [20])&gtest_ar_1.message_);
  Bytes::Bytes(&local_198,local_1a8);
  bssl::Span<unsigned_char_const>::Span<20ul>
            ((Span<unsigned_char_const> *)&local_1c8,&TestBody::kMillionADigest);
  Bytes::Bytes(&local_1b8,local_1c8);
  testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
            ((EqHelper *)local_188,"Bytes(digest)","Bytes(kMillionADigest)",&local_198,&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    message = testing::Message::operator<<
                        (&local_1d0,(char (*) [40])"Digest incorrect for \"million a\'s\" test");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/ripemd_test.cc"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,message);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_158);
  return;
}

Assistant:

TEST(RIPEMDTest, RunTest) {
  for (const auto &test : kRIPEMDTestCases) {
    SCOPED_TRACE(test.input);
    const size_t input_len = strlen(test.input);

    for (size_t stride = 0; stride <= input_len; stride++) {
      SCOPED_TRACE(stride);
      uint8_t digest[RIPEMD160_DIGEST_LENGTH];
      if (stride == 0) {
        RIPEMD160(reinterpret_cast<const uint8_t *>(test.input), input_len,
                  digest);
      } else {
        RIPEMD160_CTX ctx;
        RIPEMD160_Init(&ctx);

        for (size_t done = 0; done < input_len;) {
          const size_t remaining = input_len - done;
          size_t todo = stride;
          if (todo > remaining) {
            todo = remaining;
          }

          RIPEMD160_Update(&ctx, &test.input[done], todo);
          done += todo;
        }

        RIPEMD160_Final(digest, &ctx);
      }

      EXPECT_EQ(Bytes(digest), Bytes(test.expected));
    }
  }

  static const size_t kLargeBufSize = 1000000;
  auto buf = std::make_unique<uint8_t[]>(kLargeBufSize);
  OPENSSL_memset(buf.get(), 'a', kLargeBufSize);
  uint8_t digest[RIPEMD160_DIGEST_LENGTH];
  RIPEMD160(buf.get(), kLargeBufSize, digest);

  static const uint8_t kMillionADigest[RIPEMD160_DIGEST_LENGTH] = {
      0x52, 0x78, 0x32, 0x43, 0xc1, 0x69, 0x7b, 0xdb, 0xe1, 0x6d,
      0x37, 0xf9, 0x7f, 0x68, 0xf0, 0x83, 0x25, 0xdc, 0x15, 0x28};
  EXPECT_EQ(Bytes(digest), Bytes(kMillionADigest))
      << "Digest incorrect for \"million a's\" test";
}